

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JobResults.cpp
# Opt level: O2

void __thiscall xmrig::JobResultsPrivate::submit(JobResultsPrivate *this)

{
  JobBaton *this_00;
  undefined8 uVar1;
  _List_node_base *p_Var2;
  list<xmrig::JobBundle,_std::allocator<xmrig::JobBundle>_> bundles;
  list<xmrig::JobResult,_std::allocator<xmrig::JobResult>_> results;
  _List_base<xmrig::JobBundle,_std::allocator<xmrig::JobBundle>_> local_50;
  _List_base<xmrig::JobResult,_std::allocator<xmrig::JobResult>_> local_38;
  
  local_50._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_50;
  local_50._M_impl._M_node._M_size = 0;
  local_38._M_impl._M_node._M_size = 0;
  local_50._M_impl._M_node.super__List_node_base._M_prev =
       local_50._M_impl._M_node.super__List_node_base._M_next;
  local_38._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_38;
  local_38._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_38;
  std::mutex::lock(&this->m_mutex);
  std::__cxx11::list<xmrig::JobBundle,_std::allocator<xmrig::JobBundle>_>::swap
            (&this->m_bundles,(list<xmrig::JobBundle,_std::allocator<xmrig::JobBundle>_> *)&local_50
            );
  std::__cxx11::list<xmrig::JobResult,_std::allocator<xmrig::JobResult>_>::swap
            (&this->m_results,(list<xmrig::JobResult,_std::allocator<xmrig::JobResult>_> *)&local_38
            );
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  p_Var2 = (_List_node_base *)&local_38;
  while (p_Var2 = (((_List_base<xmrig::JobResult,_std::allocator<xmrig::JobResult>_> *)
                   &p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)&local_38) {
    (*this->m_listener->_vptr_IJobResultListener[2])(this->m_listener,p_Var2 + 1);
  }
  if (local_50._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_50) {
    this_00 = (JobBaton *)operator_new(200);
    JobBaton::JobBaton(this_00,(list<xmrig::JobBundle,_std::allocator<xmrig::JobBundle>_> *)
                               &local_50,this->m_listener,this->m_hwAES);
    uVar1 = uv_default_loop();
    uv_queue_work(uVar1,this_00,submit::anon_class_1_0_00000001::__invoke,
                  submit::anon_class_1_0_00000001::__invoke);
  }
  std::__cxx11::_List_base<xmrig::JobResult,_std::allocator<xmrig::JobResult>_>::_M_clear(&local_38)
  ;
  std::__cxx11::_List_base<xmrig::JobBundle,_std::allocator<xmrig::JobBundle>_>::_M_clear(&local_50)
  ;
  return;
}

Assistant:

inline void submit()
    {
        std::list<JobBundle> bundles;
        std::list<JobResult> results;

        m_mutex.lock();
        m_bundles.swap(bundles);
        m_results.swap(results);
        m_mutex.unlock();

        for (const auto &result : results) {
            m_listener->onJobResult(result);
        }

        if (bundles.empty()) {
            return;
        }

        auto baton = new JobBaton(std::move(bundles), m_listener, m_hwAES);

        uv_queue_work(uv_default_loop(), &baton->req,
            [](uv_work_t *req) {
                auto baton = static_cast<JobBaton*>(req->data);

                for (JobBundle &bundle : baton->bundles) {
                    getResults(bundle, baton->results, baton->errors, baton->hwAES);
                }
            },
            [](uv_work_t *req, int) {
                auto baton = static_cast<JobBaton*>(req->data);

                for (const auto &result : baton->results) {
                    baton->listener->onJobResult(result);
                }

                delete baton;
            }
        );
    }